

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O3

void my_numbox_motion(t_my_numbox *x,t_floatarg dx,t_floatarg dy,t_floatarg up)

{
  float fVar1;
  double dVar2;
  
  if ((up == 0.0) && (!NAN(up))) {
    if (x->x_lin0_log1 == 0) {
      dVar2 = (double)x->x_val -
              *(double *)(&DAT_001b7e80 + (ulong)(((x->x_gui).x_fsf.field_0x3 & 2) == 0) * 8) *
              (double)dy;
    }
    else {
      dVar2 = pow(x->x_k,(double)dy *
                         -*(double *)
                           (&DAT_001b7e80 + (ulong)(((x->x_gui).x_fsf.field_0x3 & 2) == 0) * 8));
      dVar2 = (double)x->x_val * dVar2;
    }
    x->x_val = (float)dVar2;
    dVar2 = (double)(float)dVar2;
    if (dVar2 < x->x_min) {
      fVar1 = (float)x->x_min;
      x->x_val = fVar1;
      dVar2 = (double)fVar1;
    }
    if (x->x_max < dVar2) {
      x->x_val = (float)x->x_max;
    }
    sys_queuegui(x,(x->x_gui).x_glist,my_numbox_draw_update);
    my_numbox_bang(x);
    return;
  }
  return;
}

Assistant:

static void my_numbox_motion(t_my_numbox *x, t_floatarg dx, t_floatarg dy,
    t_floatarg up)
{
    double k2 = 1.0;
    if (up != 0)
        return;

    if(x->x_gui.x_fsf.x_finemoved)
        k2 = 0.01;
    if(x->x_lin0_log1)
        x->x_val *= pow(x->x_k, -k2*dy);
    else
        x->x_val -= k2*dy;
    my_numbox_clip(x);
    sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    my_numbox_bang(x);
}